

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
          (SmallVectorBase<slang::parsing::Trivia> *this,Trivia *args)

{
  size_type sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  EVP_PKEY_CTX *pEVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  pointer pTVar11;
  
  pTVar11 = this->data_ + this->len;
  if (this->len != this->cap) {
    uVar4 = *(undefined8 *)((long)&args->field_0 + 8);
    (pTVar11->field_0).rawText.ptr = (args->field_0).rawText.ptr;
    *(undefined8 *)((long)&pTVar11->field_0 + 8) = uVar4;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar9 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar9 < ctx) {
    pEVar9 = ctx;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    pEVar9 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar10 = (long)pTVar11 - (long)this->data_;
  pTVar5 = (pointer)operator_new((long)pEVar9 << 4);
  uVar4 = *(undefined8 *)((long)&args->field_0 + 8);
  *(undefined8 *)((long)pTVar5 + lVar10) = (args->field_0).rawText.ptr;
  ((undefined8 *)((long)pTVar5 + lVar10))[1] = uVar4;
  pTVar8 = this->data_;
  pTVar6 = pTVar8 + this->len;
  pTVar7 = pTVar5;
  if (pTVar6 == pTVar11) {
    for (; pTVar8 != pTVar11; pTVar8 = pTVar8 + 1) {
      uVar4 = *(undefined8 *)((long)&pTVar8->field_0 + 8);
      (pTVar7->field_0).rawText.ptr = (pTVar8->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar7->field_0 + 8) = uVar4;
      pTVar7 = pTVar7 + 1;
    }
  }
  else {
    for (; pTVar8 != pTVar11; pTVar8 = pTVar8 + 1) {
      uVar4 = *(undefined8 *)((long)&pTVar8->field_0 + 8);
      (pTVar7->field_0).rawText.ptr = (pTVar8->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar7->field_0 + 8) = uVar4;
      pTVar7 = pTVar7 + 1;
    }
    puVar3 = (undefined8 *)(lVar10 + (long)pTVar5);
    for (; pTVar11 != pTVar6; pTVar11 = pTVar11 + 1) {
      uVar4 = *(undefined8 *)((long)&pTVar11->field_0 + 8);
      puVar3[2] = (pTVar11->field_0).rawText.ptr;
      puVar3[3] = uVar4;
      puVar3 = puVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar9;
  this->data_ = pTVar5;
  return (reference)((long)pTVar5 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }